

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
* __thiscall
fmt::v5::to_string<fmt::v5::char8_t,500ul>
          (basic_string<fmt::v5::char8_t,_std::char_traits<fmt::v5::char8_t>,_std::allocator<fmt::v5::char8_t>_>
           *__return_storage_ptr__,v5 *this,
          basic_memory_buffer<fmt::v5::char8_t,_500UL,_std::allocator<fmt::v5::char8_t>_> *buf)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::
  basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>
  ::_M_construct<fmt::v5::char8_t_const*>
            ((basic_string<fmt::v5::char8_t,std::char_traits<fmt::v5::char8_t>,std::allocator<fmt::v5::char8_t>>
              *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> to_string(const basic_memory_buffer<Char, SIZE> &buf) {
  return std::basic_string<Char>(buf.data(), buf.size());
}